

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartOutputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::MultiPartOutputFile::Data::overrideSharedAttributesValues
          (Data *this,Header *src,Header *dst)

{
  TypedAttribute<Imath_2_5::Box<Imath_2_5::Vec2<int>_>_> *pTVar1;
  TypedAttribute<float> *pTVar2;
  TypedAttribute<Imf_2_5::TimeCode> *pTVar3;
  TypedAttribute<Imf_2_5::Chromaticities> *pTVar4;
  ChromaticitiesAttribute *chromaticities;
  TimeCodeAttribute *timeCode;
  FloatAttribute *pixelAspectRatio;
  Box2iAttribute *displayWindow;
  char *in_stack_000000f8;
  Header *in_stack_00000100;
  char *in_stack_00000288;
  Header *in_stack_00000290;
  Attribute *in_stack_00000590;
  char *in_stack_00000598;
  Header *in_stack_000005a0;
  
  pTVar1 = Header::findTypedAttribute<Imf_2_5::TypedAttribute<Imath_2_5::Box<Imath_2_5::Vec2<int>>>>
                     (in_stack_00000100,in_stack_000000f8);
  if (pTVar1 == (TypedAttribute<Imath_2_5::Box<Imath_2_5::Vec2<int>_>_> *)0x0) {
    Header::erase(in_stack_00000290,in_stack_00000288);
  }
  else {
    Header::insert(in_stack_000005a0,in_stack_00000598,in_stack_00000590);
  }
  pTVar2 = Header::findTypedAttribute<Imf_2_5::TypedAttribute<float>>
                     (in_stack_00000100,in_stack_000000f8);
  if (pTVar2 == (TypedAttribute<float> *)0x0) {
    Header::erase(in_stack_00000290,in_stack_00000288);
  }
  else {
    Header::insert(in_stack_000005a0,in_stack_00000598,in_stack_00000590);
  }
  pTVar3 = Header::findTypedAttribute<Imf_2_5::TypedAttribute<Imf_2_5::TimeCode>>
                     (in_stack_00000100,in_stack_000000f8);
  if (pTVar3 == (TypedAttribute<Imf_2_5::TimeCode> *)0x0) {
    Header::erase(in_stack_00000290,in_stack_00000288);
  }
  else {
    Header::insert(in_stack_000005a0,in_stack_00000598,in_stack_00000590);
  }
  pTVar4 = Header::findTypedAttribute<Imf_2_5::TypedAttribute<Imf_2_5::Chromaticities>>
                     (in_stack_00000100,in_stack_000000f8);
  if (pTVar4 == (TypedAttribute<Imf_2_5::Chromaticities> *)0x0) {
    Header::erase(in_stack_00000290,in_stack_00000288);
  }
  else {
    Header::insert(in_stack_000005a0,in_stack_00000598,in_stack_00000590);
  }
  return;
}

Assistant:

void 
MultiPartOutputFile::Data::overrideSharedAttributesValues(const Header & src, Header & dst)
{
    //
    // Display Window
    //
    const Box2iAttribute * displayWindow = 
    src.findTypedAttribute<Box2iAttribute> ("displayWindow");
    
    if (displayWindow)
        dst.insert ("displayWindow", *displayWindow);
    else 
        dst.erase ("displayWindow");
    
    
    //
    // Pixel Aspect Ratio
    //
    const FloatAttribute * pixelAspectRatio = 
    src.findTypedAttribute<FloatAttribute> ("pixelAspectRatio");
    
    if (pixelAspectRatio)
        dst.insert ("pixelAspectRatio", *pixelAspectRatio);
    else 
        dst.erase ("pixelAspectRatio");
    
    
    //
    // Timecode
    //
    const TimeCodeAttribute * timeCode = 
    src.findTypedAttribute<TimeCodeAttribute> ("timecode");
    
    if (timeCode)
        dst.insert ("timecode", *timeCode);
    else 
        dst.erase ("timecode");
    
    
    //
    // Chromaticities
    //
    const ChromaticitiesAttribute * chromaticities = 
    src.findTypedAttribute<ChromaticitiesAttribute> ("chromaticities");
    
    if (chromaticities)
        dst.insert ("chromaticities", *chromaticities);
    else 
        dst.erase ("chromaticities");
    
}